

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O2

uint32_t aeron::BufferBuilder::findSuitableCapacity
                   (uint32_t currentCapacity,uint32_t requiredCapacity)

{
  uint uVar1;
  uint uVar2;
  IllegalStateException *this;
  char *pcVar4;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ulong uVar3;
  
  uVar3 = (ulong)currentCapacity;
  while( true ) {
    uVar1 = (uint)(uVar3 >> 1);
    uVar2 = uVar1 + currentCapacity;
    uVar3 = (ulong)uVar2;
    if ((!(bool)(~CARRY4(uVar1,currentCapacity) & uVar2 < 0xfffffff8)) &&
       (uVar3 = 0xfffffff7, currentCapacity == 0xfffffff7)) break;
    currentCapacity = (uint32_t)uVar3;
    if (requiredCapacity <= currentCapacity) {
      return currentCapacity;
    }
  }
  this = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_58,0xfffffff7);
  std::operator+(&local_38,"max capacity reached: ",&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,
             "static std::uint32_t aeron::BufferBuilder::findSuitableCapacity(std::uint32_t, std::uint32_t)"
             ,&local_99);
  pcVar4 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/BufferBuilder.h"
                            );
  std::__cxx11::string::string((string *)&local_98,pcVar4,&local_9a);
  util::IllegalStateException::IllegalStateException(this,&local_38,&local_78,&local_98,0x68);
  __cxa_throw(this,&util::IllegalStateException::typeinfo,util::SourcedException::~SourcedException)
  ;
}

Assistant:

inline static std::uint32_t findSuitableCapacity(std::uint32_t currentCapacity, std::uint32_t requiredCapacity)
    {
        std::uint32_t capacity = currentCapacity;

        do
        {
            const std::uint32_t newCapacity = capacity + (capacity >> 1);

            if (newCapacity < capacity || newCapacity > BUFFER_BUILDER_MAX_CAPACITY)
            {
                if (capacity == BUFFER_BUILDER_MAX_CAPACITY)
                {
                    throw util::IllegalStateException(
                        "max capacity reached: " + std::to_string(BUFFER_BUILDER_MAX_CAPACITY), SOURCEINFO);
                }

                capacity = BUFFER_BUILDER_MAX_CAPACITY;
            }
            else
            {
                capacity = newCapacity;
            }
        }
        while (capacity < requiredCapacity);

        return capacity;
    }